

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  undefined1 uVar1;
  undefined7 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  byte bVar6;
  ZyanStatus ZVar7;
  byte bVar8;
  ZydisDecoderContext *pZVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ZyanU8 ZVar16;
  ulong uVar17;
  ZyanUSize ZVar18;
  byte bVar19;
  ulong uVar20;
  ZyanU8 *pZVar21;
  bool bVar22;
  ZydisDecoderContext default_context;
  byte local_d2;
  ZyanU8 local_d1;
  ZyanU8 local_d0;
  ZyanU8 local_cf;
  ZyanBool local_ce;
  ZyanU8 local_cd;
  byte local_cc;
  ZyanU8 local_cb;
  byte local_ca;
  ZyanU8 local_c9;
  uint local_c8;
  uint local_c4;
  ZydisDecoderState local_c0;
  uint local_90;
  ZydisMachineMode local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ZydisDecoderContext *local_58;
  ZydisDecoderContext local_50;
  
  ZVar7 = 0x80100004;
  if ((instruction != (ZydisDecodedInstruction *)0x0 && decoder != (ZydisDecoder *)0x0) &&
     (ZVar7 = 0x80200000, length != 0 && buffer != (void *)0x0)) {
    local_c0.prefixes.has_lock = '\0';
    local_c0.prefixes.group1 = '\0';
    local_c0.prefixes.group2 = '\0';
    local_c0.prefixes.effective_segment = '\0';
    local_c0.prefixes.mandatory_candidate = '\0';
    local_c0.prefixes.offset_lock = '\0';
    local_c0.prefixes.offset_group1 = '\0';
    local_c0.prefixes.offset_group2 = '\0';
    pZVar9 = &local_50;
    local_c0.context = context;
    if (context == (ZydisDecoderContext *)0x0) {
      local_c0.context = pZVar9;
    }
    local_c0.prefixes.offset_osz_override = '\0';
    local_c0.prefixes.offset_asz_override = '\0';
    local_c0.prefixes.offset_segment = '\0';
    local_c0.prefixes.offset_mandatory = '\0';
    local_c0.prefixes.offset_notrack = -1;
    local_c0._45_3_ = 0;
    *(undefined8 *)&((local_c0.context)->vector_unified).R2 = 0;
    *(undefined8 *)&((local_c0.context)->reg_info).id_base = 0;
    (local_c0.context)->definition = (void *)0x0;
    (local_c0.context)->eosz_index = '\0';
    (local_c0.context)->easz_index = '\0';
    ((local_c0.context)->vector_unified).W = '\0';
    ((local_c0.context)->vector_unified).R = '\0';
    ((local_c0.context)->vector_unified).X = '\0';
    ((local_c0.context)->vector_unified).B = '\0';
    ((local_c0.context)->vector_unified).L = '\0';
    ((local_c0.context)->vector_unified).LL = '\0';
    local_80 = 0;
    local_c0.decoder = decoder;
    local_c0.buffer = (ZyanU8 *)buffer;
    local_c0.buffer_len = length;
    local_58 = context;
    memset(instruction,0,0x168);
    uVar3 = local_c0._40_8_;
    local_8c = decoder->machine_mode;
    instruction->machine_mode = local_8c;
    uVar1 = (undefined1)decoder->stack_width;
    uVar10 = CONCAT71((int7)((ulong)pZVar9 >> 8),uVar1);
    instruction->stack_width = (ZyanU8)(0x10 << (uVar1 & 0x1f));
    local_cf = local_c0.prefixes.offset_asz_override;
    local_d0 = local_c0.prefixes.offset_osz_override;
    local_c8 = (uint)local_c0.prefixes.mandatory_candidate;
    local_c4 = (uint)local_c0.prefixes.offset_mandatory;
    local_d2 = local_c0.prefixes.group2;
    local_d1 = local_c0.prefixes.offset_group2;
    local_ca = local_c0.prefixes.effective_segment;
    local_c9 = local_c0.prefixes.offset_segment;
    uVar14 = (ulong)local_c0._40_8_ >> 0x20 & 0xff;
    local_cc = local_c0.prefixes.group1;
    local_cb = local_c0.prefixes.offset_group1;
    local_ce = local_c0.prefixes.has_lock;
    local_cd = local_c0.prefixes.offset_lock;
    local_78 = 0;
    uVar15 = 0;
    local_68 = 0;
    local_70 = 0;
    local_88 = 0;
    local_60 = 0;
    local_90 = 0;
    uVar20 = 0;
    uVar17 = 0;
    ZVar18 = length;
    pZVar21 = (ZyanU8 *)buffer;
    do {
      if (length == uVar17) {
        return 0x80200000;
      }
      bVar6 = *(byte *)((long)buffer + uVar17);
      uVar10 = CONCAT71((int7)(uVar10 >> 8),bVar6);
      ZVar16 = (ZyanU8)uVar17;
      bVar19 = (byte)uVar20;
      if (bVar6 < 0x67) {
        uVar13 = bVar6 - 0x26;
        if (uVar13 < 0x40) {
          if ((0x1010101UL >> ((ulong)uVar13 & 0x3f) & 1) == 0) {
            if ((0xc000000000000000U >> ((ulong)uVar13 & 0x3f) & 1) == 0) goto LAB_00107d30;
          }
          else if (local_8c == ZYDIS_MACHINE_MODE_LONG_64) {
            uVar12 = uVar14 & 0xff;
            uVar14 = uVar17 & 0xffffffff;
            if (((byte)local_60 & 0xfe) == 100) {
              uVar14 = uVar12;
            }
            if (bVar6 != 0x3e) {
              uVar14 = uVar12;
            }
            local_80 = uVar17 & 0xff;
            local_78 = uVar10 & 0xffffffff;
            local_d2 = bVar6;
            local_d1 = ZVar16;
            goto LAB_00107dbd;
          }
          uVar14 = 0xff;
          local_80 = CONCAT71((int7)(local_c0.buffer_len >> 8),ZVar16);
          local_78 = uVar10 & 0xffffffff;
          local_60 = uVar10 & 0xffffffff;
          local_d2 = bVar6;
          local_d1 = ZVar16;
          local_ca = bVar6;
          local_c9 = ZVar16;
          goto LAB_00107dbd;
        }
LAB_00107d30:
        if (bVar6 == 0x66) {
          bVar22 = (char)local_90 == '\0';
          local_c4 = local_c4 & 0xff;
          if (bVar22) {
            local_c4 = (uint)uVar17;
          }
          local_c8 = local_c8 & 0xff;
          if (bVar22) {
            local_c8 = 0x66;
          }
          local_90 = local_90 & 0xff;
          if (bVar22) {
            local_90 = 0x66;
          }
          local_88 = local_88 | 0x80000000000;
          instruction->attributes = local_88;
          local_70 = uVar17 & 0xffffffff;
          local_d0 = ZVar16;
          goto LAB_00107dbd;
        }
LAB_00107e08:
        if ((local_8c != ZYDIS_MACHINE_MODE_LONG_64) || ((bVar6 & 0xf0) != 0x40)) {
          local_c0.prefixes.offset_asz_override = local_cf;
          local_c0.prefixes.offset_osz_override = local_d0;
          local_c0.prefixes._0_8_ = (ulong)(byte)local_c8 << 0x20;
          local_c0.prefixes._0_7_ = (uint7)CONCAT51(local_c0.prefixes._3_5_,local_d2) << 0x10;
          uVar2 = local_c0.prefixes._0_7_;
          local_c0.prefixes.offset_group2 = local_d1;
          local_c0.prefixes._0_3_ = SUB73(uVar2,0);
          local_c0.prefixes.effective_segment = local_ca;
          local_c0.prefixes.offset_segment = local_c9;
          local_c0.prefixes.offset_mandatory = (char)local_c4;
          uVar5 = local_c0.prefixes._8_4_;
          local_c0._45_3_ = SUB83(uVar3,5);
          local_c0.prefixes.offset_notrack = (ZyanI8)uVar14;
          local_c0.prefixes._0_6_ = (int6)CONCAT61(local_c0.prefixes._2_6_,local_cc) << 8;
          local_c0.prefixes.offset_group1 = local_cb;
          uVar3 = local_c0.prefixes._0_8_;
          local_c0.prefixes.has_lock = local_ce;
          uVar4 = local_c0.prefixes._0_8_;
          local_c0.prefixes._6_2_ = SUB82(uVar3,6);
          local_c0.prefixes._0_5_ = SUB85(uVar4,0);
          local_c0.prefixes.offset_lock = local_cd;
          if ((local_88 & 0x80000000000) != 0) {
            (instruction->raw).prefixes[local_70 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          if ((local_88 & 0x100000000000) != 0) {
            (instruction->raw).prefixes[local_68 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          if (bVar19 != 0) {
            (instruction->raw).prefixes[uVar15 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            if ((bVar19 & 0xf0) != 0x40) {
              __assert_fail("(data & 0xF0) == 0x40",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x17a,
                            "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                           );
            }
            bVar6 = (byte)(uVar20 >> 3) & 1;
            bVar8 = (byte)(uVar20 >> 2) & 1;
            bVar11 = (byte)(uVar20 >> 1) & 1;
            instruction->attributes = local_88 | 4;
            (instruction->raw).rex.W = bVar6;
            (instruction->raw).rex.R = bVar8;
            (instruction->raw).rex.X = bVar11;
            (instruction->raw).rex.B = bVar19 & 1;
            pZVar9 = &local_50;
            if (local_58 != (ZydisDecoderContext *)0x0) {
              pZVar9 = local_58;
            }
            (pZVar9->vector_unified).W = bVar6;
            (pZVar9->vector_unified).R = bVar8;
            (pZVar9->vector_unified).X = bVar11;
            (pZVar9->vector_unified).B = bVar19 & 1;
          }
          if ((local_8c != ZYDIS_MACHINE_MODE_LONG_64) && ((char)local_78 == '>')) {
            local_c0.prefixes.offset_notrack = (ZyanI8)local_80;
            local_c0.prefixes._8_5_ = CONCAT14(local_c0.prefixes.offset_notrack,uVar5);
          }
          ZVar7 = ZydisDecodeInstruction(&local_c0,instruction);
          if (-1 < (int)ZVar7) {
            return 0x100000;
          }
          return ZVar7;
        }
        uVar15 = uVar17 & 0xffffffff;
        uVar20 = uVar10 & 0xffffffff;
LAB_00107dd5:
        (instruction->raw).rex.offset = (ZyanU8)uVar15;
      }
      else {
        if (bVar6 - 0xf2 < 2) {
          local_c4 = (uint)uVar17 & 0xff;
          local_cc = bVar6;
          local_cb = ZVar16;
          local_c8 = (uint)uVar10;
          local_90 = (uint)uVar10;
        }
        else if (bVar6 == 0x67) {
          local_88 = local_88 | 0x100000000000;
          instruction->attributes = local_88;
          local_68 = uVar17 & 0xffffffff;
          local_cf = ZVar16;
        }
        else {
          if (bVar6 != 0xf0) goto LAB_00107e08;
          local_ce = '\x01';
          local_cd = ZVar16;
        }
LAB_00107dbd:
        if (bVar19 != bVar6 && bVar19 != 0) {
          uVar15 = 0;
          uVar20 = 0;
          goto LAB_00107dd5;
        }
      }
      uVar12 = uVar17 + 1;
      (instruction->raw).prefix_count = (ZyanU8)uVar12;
      (instruction->raw).prefixes[uVar17].value = bVar6;
      instruction->length = (ZyanU8)uVar12;
      local_c0.buffer = pZVar21 + 1;
      local_c0.buffer_len = ZVar18 - 1;
      uVar17 = uVar12;
      ZVar18 = local_c0.buffer_len;
      pZVar21 = local_c0.buffer;
    } while (uVar12 != 0xf);
    ZVar7 = 0x80200002;
  }
  return ZVar7;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!buffer || !length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    return ZYAN_STATUS_SUCCESS;
}